

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  value_type_conflict4 vVar1;
  uint uVar2;
  value_type_conflict4 *pvVar3;
  value_type_conflict *pvVar4;
  uint i;
  value_type_conflict vVar5;
  
  uVar2 = (this->IndexLookup).Size;
  if ((int)uVar2 < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                  ,0x8da,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  i = (uint)dst;
  if (dst < uVar2) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,dst + 1);
    if (uVar2 <= src) {
      pvVar3 = ImVector<unsigned_short>::operator[](&this->IndexLookup,i);
      *pvVar3 = 0xffff;
      vVar5 = 1.0;
      goto LAB_00188237;
    }
  }
  else {
    if (uVar2 <= src) {
      return;
    }
    GrowIndex(this,dst + 1);
  }
  vVar1 = (this->IndexLookup).Data[src];
  pvVar3 = ImVector<unsigned_short>::operator[](&this->IndexLookup,i);
  *pvVar3 = vVar1;
  vVar5 = (this->IndexAdvanceX).Data[src];
LAB_00188237:
  pvVar4 = ImVector<float>::operator[](&this->IndexAdvanceX,i);
  *pvVar4 = vVar5;
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    int index_size = IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (unsigned short)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (unsigned short)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}